

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void setup_movable_items(tgestate_t *state)

{
  undefined8 *puVar1;
  room_t rVar2;
  uint16_t uVar3;
  short sVar4;
  spritedef_t *psVar5;
  long lVar6;
  character_t cVar7;
  char cVar8;
  vischar_t *vischar;
  
  vischar = state->vischars;
  cVar8 = -7;
  do {
    vischar = vischar + 1;
    reset_visible_character(state,vischar);
    cVar8 = cVar8 + '\x01';
  } while (cVar8 != '\0');
  rVar2 = state->room_index;
  if (rVar2 == '\x02') {
    cVar7 = '\x1a';
    lVar6 = 0x128;
  }
  else if (rVar2 == '\t') {
    cVar7 = '\x1c';
    lVar6 = 0x140;
  }
  else {
    if (rVar2 != '\x04') goto LAB_00105760;
    cVar7 = '\x1b';
    lVar6 = 0x158;
  }
  state->vischars[1].character = cVar7;
  puVar1 = (undefined8 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar6 + -0x20);
  psVar5 = (spritedef_t *)puVar1[1];
  *(undefined8 *)&state->vischars[1].mi = *puVar1;
  state->vischars[1].mi.sprite = psVar5;
  *(undefined8 *)&state->vischars[1].mi.sprite_index =
       *(undefined8 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar6 + -0x10);
  state->vischars[1].flags = '\0';
  state->vischars[1].route.index = '\0';
  state->vischars[1].route.step = '\0';
  state->vischars[1].target.u = '\0';
  state->vischars[1].target.u = '\0';
  state->vischars[1].target.v = '\0';
  state->vischars[1].target.w = '\0';
  state->vischars[1].counter_and_flags = '\0';
  state->vischars[1].animbase = animations;
  state->vischars[1].anim = animations[8];
  state->vischars[1].animindex = '\0';
  state->vischars[1].input = '\0';
  state->vischars[1].direction = '\0';
  state->vischars[1].room = rVar2;
  *(undefined4 *)&state->saved_mappos =
       *(undefined4 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar6 + -0x20);
  (state->saved_mappos).pos16.w =
       *(uint16_t *)((long)state->jmpbuf_main[0].__jmpbuf + lVar6 + -0x1c);
  uVar3 = (state->saved_mappos).pos16.v;
  sVar4 = (short)*(undefined4 *)&state->saved_mappos;
  state->vischars[1].isopos.x = (uVar3 - sVar4) * 2 + 0x400;
  state->vischars[1].isopos.y = 0x800 - (sVar4 + uVar3 + (state->saved_mappos).pos16.w);
LAB_00105760:
  spawn_characters(state);
  mark_nearby_items(state);
  animate(state);
  move_map(state);
  plot_sprites(state);
  return;
}

Assistant:

void setup_movable_items(tgestate_t *state)
{
  const movableitem_t *movableitem;
  character_t          character;

  assert(state != NULL);

  reset_nonplayer_visible_characters(state);

  /* Conv: Use a switch statement rather than if-else and gotos. */

  switch (state->room_index)
  {
  case room_2_HUT2LEFT:
    movableitem = &state->movable_items[movable_item_STOVE1];
    character   = character_26_STOVE_1;
    setup_movable_item(state, movableitem, character);
    break;

  case room_4_HUT3LEFT:
    movableitem = &state->movable_items[movable_item_STOVE2];
    character   = character_27_STOVE_2;
    setup_movable_item(state, movableitem, character);
    break;

  case room_9_CRATE:
    movableitem = &state->movable_items[movable_item_CRATE];
    character   = character_28_CRATE;
    setup_movable_item(state, movableitem, character);
    break;

  default:
    break;
  }

  spawn_characters(state);
  mark_nearby_items(state);
  animate(state);
  move_map(state);
  plot_sprites(state);
}